

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<Fad<long_double>_>::Resize(TPZVec<Fad<long_double>_> *this,int64_t newsize)

{
  undefined8 *puVar1;
  Fad<long_double> *pFVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  long lVar9;
  long lVar10;
  Vector<long_double> *this_00;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ",0x27);
    poVar5 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::ostream::flush();
  }
  lVar10 = this->fNElements;
  if (lVar10 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pFVar2 = this->fStore;
      if (pFVar2 != (Fad<long_double> *)0x0) {
        lVar10 = *(long *)((long)&pFVar2[-1].defaultVal + 8);
        if (lVar10 != 0) {
          lVar9 = lVar10 * 0x30;
          do {
            pvVar8 = *(void **)((long)pFVar2 + lVar9 + -0x18);
            if (pvVar8 != (void *)0x0) {
              operator_delete__(pvVar8);
            }
            *(undefined4 *)((long)pFVar2 + lVar9 + -0x20) = 0;
            *(undefined8 *)((long)pFVar2 + lVar9 + -0x18) = 0;
            lVar9 = lVar9 + -0x30;
          } while (lVar9 != 0);
        }
        operator_delete__(&pFVar2[-1].defaultVal,lVar10 * 0x30 + 0x10);
      }
      this->fStore = (Fad<long_double> *)0x0;
    }
    else {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = newsize;
      uVar6 = SUB168(auVar4 * ZEXT816(0x30),0);
      uVar7 = uVar6 + 0x10;
      if (0xffffffffffffffef < uVar6) {
        uVar7 = 0xffffffffffffffff;
      }
      uVar6 = 0xffffffffffffffff;
      if (SUB168(auVar4 * ZEXT816(0x30),8) == 0) {
        uVar6 = uVar7;
      }
      pvVar8 = operator_new__(uVar6);
      *(int64_t *)((long)pvVar8 + 8) = newsize;
      lVar9 = 0;
      do {
        *(longdouble *)((long)pvVar8 + lVar9 + 0x10) = (longdouble)0;
        *(undefined4 *)((long)pvVar8 + lVar9 + 0x20) = 0;
        puVar1 = (undefined8 *)((long)pvVar8 + lVar9 + 0x28);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined2 *)((long)pvVar8 + lVar9 + 0x38) = 0;
        lVar9 = lVar9 + 0x30;
      } while (newsize * 0x30 != lVar9);
      if (newsize <= lVar10) {
        lVar10 = newsize;
      }
      if (0 < lVar10) {
        this_00 = (Vector<long_double> *)((long)pvVar8 + 0x20);
        lVar9 = 0x20;
        do {
          pFVar2 = this->fStore;
          *(unkbyte10 *)(this_00 + -1) = *(unkbyte10 *)((long)pFVar2 + lVar9 + -0x20);
          Vector<long_double>::operator=
                    (this_00,(Vector<long_double> *)((long)pFVar2 + lVar9 + -0x10));
          *(unkbyte10 *)(this_00 + 1) = *(unkbyte10 *)((long)&pFVar2->val_ + lVar9);
          this_00 = this_00 + 3;
          lVar9 = lVar9 + 0x30;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      pFVar2 = this->fStore;
      if (pFVar2 != (Fad<long_double> *)0x0) {
        lVar10 = *(long *)((long)&pFVar2[-1].defaultVal + 8);
        if (lVar10 != 0) {
          lVar9 = lVar10 * 0x30;
          do {
            pvVar3 = *(void **)((long)pFVar2 + lVar9 + -0x18);
            if (pvVar3 != (void *)0x0) {
              operator_delete__(pvVar3);
            }
            *(undefined4 *)((long)pFVar2 + lVar9 + -0x20) = 0;
            *(undefined8 *)((long)pFVar2 + lVar9 + -0x18) = 0;
            lVar9 = lVar9 + -0x30;
          } while (lVar9 != 0);
        }
        operator_delete__(&pFVar2[-1].defaultVal,lVar10 * 0x30 + 0x10);
      }
      this->fStore = (Fad<long_double> *)((long)pvVar8 + 0x10);
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}